

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O2

void __thiscall cppassert::internal::StackTraceImpl::collect(StackTraceImpl *this)

{
  int iVar1;
  char **ppcVar2;
  ulong uVar3;
  BackTraceSymbol *this_00;
  CppDemangler demangler;
  BackTraceSymbol local_40;
  
  freeSymbols(this);
  demangler.funcNameSize_ = 0x100;
  demangler.funcName_ = (char *)malloc(0x100);
  iVar1 = backtrace(this->backtrace_,0x100);
  this->backtraceSize_ = (long)iVar1;
  ppcVar2 = (char **)backtrace_symbols(this->backtrace_,iVar1);
  this->symbols_ = ppcVar2;
  this_00 = this->demangledSymbols_ + 2;
  for (uVar3 = 2; uVar3 < this->backtraceSize_; uVar3 = uVar3 + 1) {
    if (this->symbols_ == (char **)0x0) {
      local_40.symbol_ = "<unkown>";
      local_40.allocated_ = (char *)0x0;
    }
    else {
      BackTraceSymbol::createFromBacktraceStr(&local_40,this->symbols_[uVar3],&demangler);
    }
    BackTraceSymbol::operator=(this_00,&local_40);
    BackTraceSymbol::deallocate(&local_40);
    this_00[-0x102].symbol_ = (char *)this->backtrace_[uVar3];
    this_00[-0x102].allocated_ = this_00->symbol_;
    this_00 = this_00 + 1;
  }
  free(demangler.funcName_);
  return;
}

Assistant:

void collect()
    {
        freeSymbols();
        CppDemangler demangler;
        backtraceSize_ = ::backtrace(backtrace_, BufferSize);
        symbols_ = ::backtrace_symbols(backtrace_, backtraceSize_);

        for(std::size_t i=cFramesToSkip; i<backtraceSize_; ++i)
        {
            if(symbols_)
            {
                demangledSymbols_[i]
                    = BackTraceSymbol::createFromBacktraceStr(symbols_[i]
                                                            , &demangler);
            }
            else
            {
                demangledSymbols_[i] = BackTraceSymbol();
            }

            frames_[i-cFramesToSkip] = StackTrace::StackFrame(backtrace_[i]
                                            , demangledSymbols_[i].symbol());
        }
    }